

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_Nodes.hpp
# Opt level: O1

IntermediateNode *
Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::SListIntermediateNode::assimilate
          (IntermediateNode *orig)

{
  int *piVar1;
  SListIntermediateNode *this;
  void **head;
  NodeIterator local_20;
  
  this = (SListIntermediateNode *)
         ::Lib::FixedSizeAllocator<48UL>::alloc
                   ((FixedSizeAllocator<48UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
  SListIntermediateNode(this,(TermList)(orig->super_Node)._term._content,orig->childVar);
  (*(orig->super_Node)._vptr_Node[8])(&local_20,orig);
  SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::IntermediateNode::loadChildren
            ((IntermediateNode *)this,&local_20);
  if (local_20._core !=
      (IteratorCore<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node_**> *)
      0x0) {
    piVar1 = &(local_20._core)->_refCnt;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      (*(local_20._core)->_vptr_IteratorCore[1])();
    }
  }
  (orig->super_Node)._term._content = 2;
  (*(orig->super_Node)._vptr_Node[0xc])(orig);
  (*(orig->super_Node)._vptr_Node[1])(orig);
  return &this->super_IntermediateNode;
}

Assistant:

typename SubstitutionTree<LeafData_>::IntermediateNode* SubstitutionTree<LeafData_>::SListIntermediateNode
	::assimilate(IntermediateNode* orig)
{
  IntermediateNode* res= 0;
  // TODO refactor such that children are not copied here, and deleted at (2), but moved instead
  res = new SListIntermediateNode(orig->term(), orig->childVar);
  res->loadChildren(orig->allChildren());
  orig->makeEmpty();
  // TODO (2) see above
  delete orig;
  return res;
}